

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_amr_transfer.cpp
# Opt level: O3

void Omega_h::amr::transfer_inherit<long>
               (Mesh *old_mesh,Mesh *new_mesh,Few<Omega_h::Read<int>,_4> *prods2new_ents,
               Few<Omega_h::Read<int>,_4> *same_ents2old_ents,
               Few<Omega_h::Read<int>,_4> *same_ents2new_ents,string *name)

{
  int *piVar1;
  Alloc *pAVar2;
  long *plVar3;
  byte bVar4;
  Mesh *this;
  undefined8 uVar5;
  Int ncomps;
  uint uVar6;
  LO size_in;
  Tag<long> *this_00;
  Int child_dim;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  Read<long> same_data;
  Few<Omega_h::Write<signed_char>,_4> new_data;
  Read<long> old_data;
  Parents local_1d8;
  Mesh *local_1b0;
  string *local_1a8;
  Few<Omega_h::Read<int>,_4> *local_1a0;
  Write<long> local_198;
  Write<signed_char> local_188;
  LOs local_178;
  Read<signed_char> local_168;
  Read<signed_char> local_158;
  LOs local_148;
  ulong local_138 [8];
  Read<signed_char> local_f8;
  Alloc *local_e8 [2];
  undefined1 local_d8 [64];
  Int local_98;
  Alloc *local_90;
  pointer local_88;
  Alloc *local_80;
  pointer local_78;
  ulong auStack_70 [8];
  
  local_138[6] = 0;
  local_138[7] = 0;
  local_138[4] = 0;
  local_138[5] = 0;
  local_138[2] = 0;
  local_138[3] = 0;
  local_138[0] = 0;
  local_138[1] = 0;
  local_1b0 = new_mesh;
  local_1a8 = name;
  local_1a0 = same_ents2new_ents;
  this_00 = Omega_h::Mesh::get_tag<long>(old_mesh,0,name);
  ncomps = TagBase::ncomps(&this_00->super_TagBase);
  uVar6 = old_mesh->dim_;
  if (uVar6 < 4) {
    lVar7 = 0;
    uVar9 = 0;
    do {
      this = local_1b0;
      if (uVar6 < uVar9) {
        uVar9 = 0;
        do {
          if (uVar6 < uVar9) {
            lVar7 = 0x40;
            do {
              pAVar2 = *(Alloc **)((long)&local_148.write_.shared_alloc_.alloc + lVar7);
              if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
                piVar1 = &pAVar2->use_count;
                *piVar1 = *piVar1 + -1;
                if (*piVar1 == 0) {
                  Alloc::~Alloc(pAVar2);
                  operator_delete(pAVar2,0x48);
                }
              }
              lVar7 = lVar7 + -0x10;
            } while (lVar7 != 0);
            return;
          }
          child_dim = (Int)uVar9;
          Omega_h::Mesh::ask_parents(&local_1d8,this,child_dim);
          bVar4 = entering_parallel;
          lVar7 = 0;
          do {
            plVar3 = *(long **)((long)&prods2new_ents->array_[0].write_.shared_alloc_.alloc + lVar7)
            ;
            *(long **)(local_d8 + lVar7) = plVar3;
            if (((ulong)plVar3 & 7) == 0 && plVar3 != (long *)0x0) {
              if ((bVar4 & 1) == 0) {
                *(int *)(plVar3 + 6) = (int)plVar3[6] + 1;
              }
              else {
                *(long *)(local_d8 + lVar7) = *plVar3 * 8 + 1;
              }
            }
            *(undefined8 *)(local_d8 + lVar7 + 8) =
                 *(undefined8 *)
                  ((long)&prods2new_ents->array_[0].write_.shared_alloc_.direct_ptr + lVar7);
            lVar7 = lVar7 + 0x10;
          } while (lVar7 != 0x40);
          local_98 = child_dim;
          local_90 = local_1d8.parent_idx.write_.shared_alloc_.alloc;
          if (((ulong)local_1d8.parent_idx.write_.shared_alloc_.alloc & 7) == 0 &&
              local_1d8.parent_idx.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if ((bVar4 & 1) == 0) {
              (local_1d8.parent_idx.write_.shared_alloc_.alloc)->use_count =
                   (local_1d8.parent_idx.write_.shared_alloc_.alloc)->use_count + 1;
            }
            else {
              local_90 = (Alloc *)((local_1d8.parent_idx.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
          }
          local_88 = (pointer)local_1d8.parent_idx.write_.shared_alloc_.direct_ptr;
          local_80 = local_1d8.codes.write_.shared_alloc_.alloc;
          if (((ulong)local_1d8.codes.write_.shared_alloc_.alloc & 7) == 0 &&
              local_1d8.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if ((bVar4 & 1) == 0) {
              (local_1d8.codes.write_.shared_alloc_.alloc)->use_count =
                   (local_1d8.codes.write_.shared_alloc_.alloc)->use_count + 1;
            }
            else {
              local_80 = (Alloc *)((local_1d8.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
          }
          local_78 = (pointer)local_1d8.codes.write_.shared_alloc_.direct_ptr;
          lVar7 = 0x68;
          do {
            plVar3 = *(long **)((long)&local_1a0 + lVar7);
            *(long **)(local_d8 + lVar7) = plVar3;
            if (((ulong)plVar3 & 7) == 0 && plVar3 != (long *)0x0) {
              if ((bVar4 & 1) == 0) {
                *(int *)(plVar3 + 6) = (int)plVar3[6] + 1;
              }
              else {
                *(long *)(local_d8 + lVar7) = *plVar3 * 8 + 1;
              }
            }
            *(undefined8 *)(local_d8 + lVar7 + 8) =
                 *(undefined8 *)((long)&local_198.shared_alloc_.alloc + lVar7);
            lVar7 = lVar7 + 0x10;
          } while (lVar7 != 0xa8);
          pAVar2 = prods2new_ents->array_[uVar9].write_.shared_alloc_.alloc;
          if (((ulong)pAVar2 & 1) == 0) {
            sVar8 = pAVar2->size;
          }
          else {
            sVar8 = (ulong)pAVar2 >> 3;
          }
          parallel_for<Omega_h::amr::transfer_inherit<long>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Few<Omega_h::Read<int>,4>,Omega_h::Few<Omega_h::Read<int>,4>,Omega_h::Few<Omega_h::Read<int>,4>,std::__cxx11::string_const&)::_lambda(int)_1_&>
                    ((LO)(sVar8 >> 2),(type *)local_d8);
          local_198.shared_alloc_.alloc = (Alloc *)local_138[uVar9 * 2];
          if (((ulong)local_198.shared_alloc_.alloc & 7) == 0 &&
              local_198.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == 1) {
              local_198.shared_alloc_.alloc =
                   (Alloc *)((local_198.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_198.shared_alloc_.alloc)->use_count =
                   (local_198.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_198.shared_alloc_.direct_ptr = (void *)local_138[uVar9 * 2 + 1];
          Read<long>::Read(&local_f8,&local_198);
          Omega_h::Mesh::add_tag<long>(this,child_dim,local_1a8,ncomps,(Read<long> *)&local_f8,true)
          ;
          pAVar2 = local_f8.write_.shared_alloc_.alloc;
          if (((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
              local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_f8.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_f8.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_198.shared_alloc_.alloc;
          if (((ulong)local_198.shared_alloc_.alloc & 7) == 0 &&
              local_198.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_198.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_198.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          transfer_inherit<long>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Few<Omega_h::Read<int>,4>,Omega_h::Few<Omega_h::Read<int>,4>,Omega_h::Few<Omega_h::Read<int>,4>,std::__cxx11::string_const&)
          ::{lambda(int)#1}::~basic_string((_lambda_int__1_ *)local_d8);
          pAVar2 = local_1d8.codes.write_.shared_alloc_.alloc;
          if (((ulong)local_1d8.codes.write_.shared_alloc_.alloc & 7) == 0 &&
              local_1d8.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_1d8.codes.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1d8.codes.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_1d8.parent_idx.write_.shared_alloc_.alloc;
          if (((ulong)local_1d8.parent_idx.write_.shared_alloc_.alloc & 7) == 0 &&
              local_1d8.parent_idx.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_1d8.parent_idx.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1d8.parent_idx.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          uVar9 = uVar9 + 1;
          uVar6 = old_mesh->dim_;
        } while (uVar6 < 4);
        fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
             ,0x33);
      }
      size_in = Omega_h::Mesh::nents(local_1b0,(Int)uVar9);
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
      Write<long>::Write((Write<long> *)&local_1d8,size_in,-1,(string *)local_d8);
      pAVar2 = *(Alloc **)((long)local_138 + lVar7);
      if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
        piVar1 = &pAVar2->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar2);
          operator_delete(pAVar2,0x48);
        }
      }
      *(Alloc **)((long)local_138 + lVar7) = local_1d8.parent_idx.write_.shared_alloc_.alloc;
      *(void **)((long)local_138 + lVar7 + 8) = local_1d8.parent_idx.write_.shared_alloc_.direct_ptr
      ;
      if ((((ulong)local_1d8.parent_idx.write_.shared_alloc_.alloc & 7) == 0 &&
           local_1d8.parent_idx.write_.shared_alloc_.alloc != (Alloc *)0x0) &&
         (entering_parallel == 1)) {
        (local_1d8.parent_idx.write_.shared_alloc_.alloc)->use_count =
             (local_1d8.parent_idx.write_.shared_alloc_.alloc)->use_count + -1;
        *(size_t *)((long)local_138 + lVar7) =
             (local_1d8.parent_idx.write_.shared_alloc_.alloc)->size * 8 + 1;
      }
      local_1d8.parent_idx.write_.shared_alloc_.alloc = (Alloc *)0x0;
      local_1d8.parent_idx.write_.shared_alloc_.direct_ptr = (pointer)0x0;
      if ((Alloc *)local_d8._0_8_ != (Alloc *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
      }
      Omega_h::Mesh::get_array<long>((Mesh *)local_d8,(Int)old_mesh,(string *)(uVar9 & 0xffffffff));
      local_148.write_.shared_alloc_.alloc =
           *(Alloc **)((long)&same_ents2old_ents->array_[0].write_.shared_alloc_.alloc + lVar7);
      if (((ulong)local_148.write_.shared_alloc_.alloc & 7) == 0 &&
          local_148.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == 1) {
          local_148.write_.shared_alloc_.alloc =
               (Alloc *)((local_148.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_148.write_.shared_alloc_.alloc)->use_count =
               (local_148.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_148.write_.shared_alloc_.direct_ptr =
           *(void **)((long)&same_ents2old_ents->array_[0].write_.shared_alloc_.direct_ptr + lVar7);
      local_158.write_.shared_alloc_.alloc = (Alloc *)local_d8._0_8_;
      if ((local_d8._0_8_ & 7) == 0 && (Alloc *)local_d8._0_8_ != (Alloc *)0x0) {
        if (entering_parallel == 1) {
          local_158.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_d8._0_8_ * 8 + 1);
        }
        else {
          *(int *)(local_d8._0_8_ + 0x30) = *(int *)(local_d8._0_8_ + 0x30) + 1;
        }
      }
      local_158.write_.shared_alloc_.direct_ptr = (void *)local_d8._8_8_;
      unmap<long>((Omega_h *)local_e8,&local_148,&local_158,ncomps);
      read<long>((Omega_h *)&local_1d8,(Write<signed_char> *)local_e8);
      pAVar2 = local_e8[0];
      if (((ulong)local_e8[0] & 7) == 0 && local_e8[0] != (Alloc *)0x0) {
        piVar1 = &local_e8[0]->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_e8[0]);
          operator_delete(pAVar2,0x48);
        }
      }
      pAVar2 = local_158.write_.shared_alloc_.alloc;
      if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
          local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_158.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_158.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      pAVar2 = local_148.write_.shared_alloc_.alloc;
      if (((ulong)local_148.write_.shared_alloc_.alloc & 7) == 0 &&
          local_148.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_148.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_148.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      local_168.write_.shared_alloc_.alloc = local_1d8.parent_idx.write_.shared_alloc_.alloc;
      if (((ulong)local_1d8.parent_idx.write_.shared_alloc_.alloc & 7) == 0 &&
          local_1d8.parent_idx.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == 1) {
          local_168.write_.shared_alloc_.alloc =
               (Alloc *)((local_1d8.parent_idx.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_1d8.parent_idx.write_.shared_alloc_.alloc)->use_count =
               (local_1d8.parent_idx.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_168.write_.shared_alloc_.direct_ptr =
           local_1d8.parent_idx.write_.shared_alloc_.direct_ptr;
      local_178.write_.shared_alloc_.alloc =
           *(Alloc **)((long)&local_1a0->array_[0].write_.shared_alloc_.alloc + lVar7);
      if (((ulong)local_178.write_.shared_alloc_.alloc & 7) == 0 &&
          local_178.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == 1) {
          local_178.write_.shared_alloc_.alloc =
               (Alloc *)((local_178.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_178.write_.shared_alloc_.alloc)->use_count =
               (local_178.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_178.write_.shared_alloc_.direct_ptr =
           *(void **)((long)&local_1a0->array_[0].write_.shared_alloc_.direct_ptr + lVar7);
      local_188.shared_alloc_.alloc = *(Alloc **)((long)local_138 + lVar7);
      if (((ulong)local_188.shared_alloc_.alloc & 7) == 0 &&
          local_188.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == 1) {
          local_188.shared_alloc_.alloc = (Alloc *)((local_188.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_188.shared_alloc_.alloc)->use_count =
               (local_188.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_188.shared_alloc_.direct_ptr = *(void **)((long)local_138 + lVar7 + 8);
      map_into<long>(&local_168,&local_178,&local_188,ncomps);
      pAVar2 = local_188.shared_alloc_.alloc;
      if (((ulong)local_188.shared_alloc_.alloc & 7) == 0 &&
          local_188.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_188.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_188.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      pAVar2 = local_178.write_.shared_alloc_.alloc;
      if (((ulong)local_178.write_.shared_alloc_.alloc & 7) == 0 &&
          local_178.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_178.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_178.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      pAVar2 = local_168.write_.shared_alloc_.alloc;
      if (((ulong)local_168.write_.shared_alloc_.alloc & 7) == 0 &&
          local_168.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_168.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_168.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      pAVar2 = local_1d8.parent_idx.write_.shared_alloc_.alloc;
      if (((ulong)local_1d8.parent_idx.write_.shared_alloc_.alloc & 7) == 0 &&
          local_1d8.parent_idx.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_1d8.parent_idx.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_1d8.parent_idx.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      uVar5 = local_d8._0_8_;
      if ((local_d8._0_8_ & 7) == 0 && (Alloc *)local_d8._0_8_ != (Alloc *)0x0) {
        piVar1 = (int *)(local_d8._0_8_ + 0x30);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc((Alloc *)local_d8._0_8_);
          operator_delete((void *)uVar5,0x48);
        }
      }
      uVar9 = uVar9 + 1;
      uVar6 = old_mesh->dim_;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < 4);
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

void transfer_inherit(Mesh* old_mesh, Mesh* new_mesh,
    Few<LOs, 4> const prods2new_ents, Few<LOs, 4> same_ents2old_ents,
    Few<LOs, 4> same_ents2new_ents, std::string const& name) {
  Few<Write<T>, 4> new_data;
  auto ncomps = old_mesh->get_tag<T>(0, name)->ncomps();
  for (Int prod_dim = 0; prod_dim <= old_mesh->dim(); ++prod_dim) {
    new_data[prod_dim] = Write<T>(new_mesh->nents(prod_dim), -1);
    auto old_data = old_mesh->get_array<T>(prod_dim, name);
    auto same_data =
        read(unmap(same_ents2old_ents[prod_dim], old_data, ncomps));
    map_into(
        same_data, same_ents2new_ents[prod_dim], new_data[prod_dim], ncomps);
  }
  for (Int prod_dim = 0; prod_dim <= old_mesh->dim(); ++prod_dim) {
    auto parents = new_mesh->ask_parents(prod_dim);
    auto f = OMEGA_H_LAMBDA(LO prod) {
      auto prod_ent = prods2new_ents[prod_dim][prod];
      auto parent_ent = parents.parent_idx[prod_ent];
      auto code = parents.codes[prod_ent];
      auto parent_dim = code_parent_dim(code);
      new_data[prod_dim][prod_ent] = new_data[parent_dim][parent_ent];
    };
    parallel_for(prods2new_ents[prod_dim].size(), f);
    new_mesh->add_tag(
        prod_dim, name, ncomps, Read<T>(new_data[prod_dim]), true);
  }
}